

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_dmc.c
# Opt level: O0

_Bool NES_DMC_np_Read(void *chip,UINT16 adr,UINT8 *val)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  NES_DMC *dmc;
  UINT8 *val_local;
  UINT16 adr_local;
  void *chip_local;
  
  if (adr == 0x4015) {
    bVar5 = 0;
    if ((*(byte *)((long)chip + 0x400ac) & 1) != 0) {
      bVar5 = 0x80;
    }
    bVar1 = 0;
    if ((*(byte *)((long)chip + 0x40118) & 1) != 0) {
      bVar1 = 0x40;
    }
    bVar2 = 0;
    if (*(int *)((long)chip + 0x40080) != 0) {
      bVar2 = 0x10;
    }
    bVar3 = 0;
    if (*(int *)((long)chip + 0x400fc) != 0) {
      bVar3 = 8;
    }
    bVar4 = 0;
    if (*(int *)((long)chip + 0x400f8) != 0) {
      bVar4 = 4;
    }
    *val = *val | bVar5 | bVar1 | bVar2 | bVar3 | bVar4;
    *(undefined1 *)((long)chip + 0x40118) = 0;
    chip_local._7_1_ = true;
  }
  else if ((adr < 0x4008) || (0x4014 < adr)) {
    chip_local._7_1_ = false;
  }
  else {
    *val = *val | *(byte *)((long)chip + (long)(int)(adr - 0x4008) + 0x4004c);
    chip_local._7_1_ = true;
  }
  return chip_local._7_1_;
}

Assistant:

bool NES_DMC_np_Read(void* chip, UINT16 adr, UINT8* val)
{
	NES_DMC* dmc = (NES_DMC*)chip;

	if (adr == 0x4015)
	{
		*val |=(dmc->irq               ? 0x80 : 0)
			 | (dmc->frame_irq         ? 0x40 : 0)
			 | ((dmc->dlength>0)       ? 0x10 : 0)
			 | (dmc->length_counter[1] ? 0x08 : 0)
			 | (dmc->length_counter[0] ? 0x04 : 0)
			 ;

		dmc->frame_irq = false;
		//cpu->UpdateIRQ(NES_CPU::IRQD_FRAME, false);
		return true;
	}
	else if (0x4008<=adr&&adr<=0x4014)
	{
		*val |= dmc->reg[adr-0x4008];
		return true;
	}
	else
		return false;
}